

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O2

void Vec_WrdDumpHex(char *pFileName,Vec_Wrd_t *p,int nWords,int fVerbose)

{
  word *pwVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  int k;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = (long)p->nSize / (long)nWords;
  uVar6 = uVar8 & 0xffffffff;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if (p->nSize % nWords == 0) {
    iVar3 = nWords << 4;
    if (nWords << 4 < 1) {
      iVar3 = 0;
    }
    if ((int)uVar8 < 1) {
      uVar6 = 0;
    }
    uVar8 = 0;
    while( true ) {
      if (uVar8 == uVar6) {
        fclose(__stream);
        printf("Written %d words of simulation data for %d objects into file \"%s\".\n",
               (ulong)(uint)nWords,(long)p->nSize / (long)nWords & 0xffffffff,pFileName);
        return;
      }
      lVar7 = uVar8 * (long)nWords;
      if ((lVar7 < 0) || (p->nSize <= lVar7)) break;
      pwVar1 = p->pArray;
      bVar5 = 0;
      for (uVar4 = 0; iVar3 != (int)uVar4; uVar4 = (ulong)((int)uVar4 + 1)) {
        uVar2 = (uint)(pwVar1[lVar7 + (uVar4 >> 4)] >> (bVar5 & 0x3c)) & 0xf;
        if (uVar2 < 10) {
          fprintf(__stream,"%d");
        }
        else {
          fputc(uVar2 + 0x37,__stream);
        }
        bVar5 = bVar5 + 4;
      }
      fputc(10,__stream);
      uVar8 = uVar8 + 1;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                  ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  __assert_fail("Vec_WrdSize(p) % nWords == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x4f6,"void Vec_WrdDumpHex(char *, Vec_Wrd_t *, int, int)");
}

Assistant:

static inline void Vec_WrdDumpHex( char * pFileName, Vec_Wrd_t * p, int nWords, int fVerbose )
{
    int i, nNodes = Vec_WrdSize(p) / nWords;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    for ( i = 0; i < nNodes; i++ )
        Gia_ManSimPatWriteOne( pFile, Vec_WrdEntryP(p, i*nWords), nWords );
    fclose( pFile );
    if ( fVerbose )
        printf( "Written %d words of simulation data for %d objects into file \"%s\".\n", nWords, Vec_WrdSize(p)/nWords, pFileName );
}